

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall jsonnet::internal::ClonePass::expr(ClonePass *this,AST **ast_)

{
  long lVar1;
  Index *pIVar2;
  ostream *poVar3;
  
  pIVar2 = (Index *)*ast_;
  switch((pIVar2->super_AST).type) {
  case AST_APPLY:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Apply::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16b,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Apply>
                                ((this->super_CompilerPass).alloc,(Apply *)pIVar2);
    break;
  case AST_APPLY_BRACE:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16c,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::ApplyBrace>
                                ((this->super_CompilerPass).alloc,(ApplyBrace *)pIVar2);
    break;
  case AST_ARRAY:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Array::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16d,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Array>
                                ((this->super_CompilerPass).alloc,(Array *)pIVar2);
    break;
  case AST_ARRAY_COMPREHENSION:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<ArrayComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x16e,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::ArrayComprehension>
                                ((this->super_CompilerPass).alloc,(ArrayComprehension *)pIVar2);
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*ast_);
    std::endl<char,std::char_traits<char>>(poVar3);
    abort();
  case AST_ASSERT:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Assert::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Assert *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x170,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Assert>
                                ((this->super_CompilerPass).alloc,(Assert *)pIVar2);
    break;
  case AST_BINARY:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Binary::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x171,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Binary>
                                ((this->super_CompilerPass).alloc,(Binary *)pIVar2);
    break;
  case AST_BUILTIN_FUNCTION:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x172,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::BuiltinFunction>
                                ((this->super_CompilerPass).alloc,(BuiltinFunction *)pIVar2);
    break;
  case AST_CONDITIONAL:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Conditional::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x173,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Conditional>
                                ((this->super_CompilerPass).alloc,(Conditional *)pIVar2);
    break;
  case AST_DESUGARED_OBJECT:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&DesugaredObject::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x174,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::DesugaredObject>
                                ((this->super_CompilerPass).alloc,(DesugaredObject *)pIVar2);
    break;
  case AST_DOLLAR:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Dollar::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Dollar *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x175,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Dollar>
                                ((this->super_CompilerPass).alloc,(Dollar *)pIVar2);
    break;
  case AST_ERROR:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Error::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x176,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Error>
                                ((this->super_CompilerPass).alloc,(Error *)pIVar2);
    break;
  case AST_FUNCTION:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Function::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x177,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Function>
                                ((this->super_CompilerPass).alloc,(Function *)pIVar2);
    break;
  case AST_IMPORT:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Import::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x178,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Import>
                                ((this->super_CompilerPass).alloc,(Import *)pIVar2);
    break;
  case AST_IMPORTSTR:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Importstr::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x179,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Importstr>
                                ((this->super_CompilerPass).alloc,(Importstr *)pIVar2);
    break;
  case AST_IMPORTBIN:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Importbin::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17a,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Importbin>
                                ((this->super_CompilerPass).alloc,(Importbin *)pIVar2);
    break;
  case AST_INDEX:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Index::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17b,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = Allocator::clone<jsonnet::internal::Index>((this->super_CompilerPass).alloc,pIVar2);
    break;
  case AST_IN_SUPER:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&InSuper::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17c,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::InSuper>
                                ((this->super_CompilerPass).alloc,(InSuper *)pIVar2);
    break;
  case AST_LITERAL_BOOLEAN:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17d,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::LiteralBoolean>
                                ((this->super_CompilerPass).alloc,(LiteralBoolean *)pIVar2);
    break;
  case AST_LITERAL_NULL:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&LiteralNull::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17e,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::LiteralNull>
                                ((this->super_CompilerPass).alloc,(LiteralNull *)pIVar2);
    break;
  case AST_LITERAL_NUMBER:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&LiteralNumber::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x17f,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::LiteralNumber>
                                ((this->super_CompilerPass).alloc,(LiteralNumber *)pIVar2);
    break;
  case AST_LITERAL_STRING:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&LiteralString::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x180,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::LiteralString>
                                ((this->super_CompilerPass).alloc,(LiteralString *)pIVar2);
    break;
  case AST_LOCAL:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Local::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x181,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Local>
                                ((this->super_CompilerPass).alloc,(Local *)pIVar2);
    break;
  case AST_OBJECT:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Object::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Object *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x182,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Object>
                                ((this->super_CompilerPass).alloc,(Object *)pIVar2);
    break;
  case AST_OBJECT_COMPREHENSION:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x183,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::ObjectComprehension>
                                ((this->super_CompilerPass).alloc,(ObjectComprehension *)pIVar2);
    break;
  case AST_OBJECT_COMPREHENSION_SIMPLE:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x184,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::ObjectComprehensionSimple>
                                ((this->super_CompilerPass).alloc,
                                 (ObjectComprehensionSimple *)pIVar2);
    break;
  case AST_PARENS:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Parens::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Parens *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x185,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Parens>
                                ((this->super_CompilerPass).alloc,(Parens *)pIVar2);
    break;
  case AST_SELF:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Self::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x186,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Self>
                                ((this->super_CompilerPass).alloc,(Self *)pIVar2);
    break;
  case AST_SUPER_INDEX:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&SuperIndex::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x187,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::SuperIndex>
                                ((this->super_CompilerPass).alloc,(SuperIndex *)pIVar2);
    break;
  case AST_UNARY:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Unary::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x188,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Unary>
                                ((this->super_CompilerPass).alloc,(Unary *)pIVar2);
    break;
  case AST_VAR:
    lVar1 = __dynamic_cast(pIVar2,&AST::typeinfo,&Var::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("dynamic_cast<Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x189,"virtual void jsonnet::internal::ClonePass::expr(AST *&)");
    }
    pIVar2 = (Index *)Allocator::clone<jsonnet::internal::Var>
                                ((this->super_CompilerPass).alloc,(Var *)pIVar2);
  }
  *ast_ = &pIVar2->super_AST;
  CompilerPass::expr(&this->super_CompilerPass,ast_);
  return;
}

Assistant:

void ClonePass::expr(AST *&ast_)
{
    switch(ast_->type) {
        CLONE(ast_, AST_APPLY, Apply);
        CLONE(ast_, AST_APPLY_BRACE, ApplyBrace);
        CLONE(ast_, AST_ARRAY, Array);
        CLONE(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehension);
        // CLONE(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehensionSimple);
        CLONE(ast_, AST_ASSERT, Assert);
        CLONE(ast_, AST_BINARY, Binary);
        CLONE(ast_, AST_BUILTIN_FUNCTION, BuiltinFunction);
        CLONE(ast_, AST_CONDITIONAL, Conditional);
        CLONE(ast_, AST_DESUGARED_OBJECT, DesugaredObject);
        CLONE(ast_, AST_DOLLAR, Dollar);
        CLONE(ast_, AST_ERROR, Error);
        CLONE(ast_, AST_FUNCTION, Function);
        CLONE(ast_, AST_IMPORT, Import);
        CLONE(ast_, AST_IMPORTSTR, Importstr);
        CLONE(ast_, AST_IMPORTBIN, Importbin);
        CLONE(ast_, AST_INDEX, Index);
        CLONE(ast_, AST_IN_SUPER, InSuper);
        CLONE(ast_, AST_LITERAL_BOOLEAN, LiteralBoolean);
        CLONE(ast_, AST_LITERAL_NULL, LiteralNull);
        CLONE(ast_, AST_LITERAL_NUMBER, LiteralNumber);
        CLONE(ast_, AST_LITERAL_STRING, LiteralString);
        CLONE(ast_, AST_LOCAL, Local);
        CLONE(ast_, AST_OBJECT, Object);
        CLONE(ast_, AST_OBJECT_COMPREHENSION, ObjectComprehension);
        CLONE(ast_, AST_OBJECT_COMPREHENSION_SIMPLE, ObjectComprehensionSimple);
        CLONE(ast_, AST_PARENS, Parens);
        CLONE(ast_, AST_SELF, Self);
        CLONE(ast_, AST_SUPER_INDEX, SuperIndex);
        CLONE(ast_, AST_UNARY, Unary);
        CLONE(ast_, AST_VAR, Var);
        default:
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
            break;
    }

    CompilerPass::expr(ast_);
}